

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O2

void ImDrawList_PathLineToMergeDuplicate(ImDrawList *self,ImVec2 pos)

{
  ImVec2 local_8;
  
  local_8 = pos;
  ImDrawList::PathLineToMergeDuplicate(self,&local_8);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_PathLineToMergeDuplicate (ImDrawList *larg1, ImVec2 const *larg2) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  try {
    ImDrawList_PathLineToMergeDuplicate(arg1,arg2);
    
  } catch (...) {
    
  }
}